

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void CloneEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,
                   FuncInfo *funcInfo)

{
  Scope *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  if (bVar3) {
    pSVar1 = pnodeBlock->scope;
    if ((pSVar1->m_symList == (Symbol *)0x0) || (pSVar1->m_symList->decl->nop != knopConstDecl)) {
      if (pSVar1 != byteCodeGenerator->currentScope) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x38e,"(scope == byteCodeGenerator->GetCurrentScope())",
                           "scope == byteCodeGenerator->GetCurrentScope()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
      if ((*(ushort *)&pSVar1->field_0x44 & 0x10) != 0) {
        Js::ByteCodeWriter::Unsigned1
                  (&byteCodeGenerator->m_writer,
                   (ushort)((*(ushort *)&pSVar1->field_0x44 & 2) == 0) * 2 + CloneBlockScope,
                   pSVar1->innerScopeIndex);
        return;
      }
    }
  }
  return;
}

Assistant:

void CloneEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        // Only let variables have observable behavior when there are per iteration
        // bindings.  const variables do not since they are immutable.  Therefore,
        // (and the spec agrees), only create new scope clones if the loop variable
        // is a let declaration.
        bool isConst = false;
        pnodeBlock->scope->ForEachSymbolUntil([&isConst](Symbol * const sym) {
            // Exploit the fact that a for loop sxBlock can only have let and const
            // declarations, and can only have one or the other, regardless of how
            // many syms there might be.  Thus only check the first sym.
            isConst = sym->GetDecl()->nop == knopConstDecl;
            return true;
        });

        if (!isConst)
        {
            Scope *scope = pnodeBlock->scope;
            Assert(scope == byteCodeGenerator->GetCurrentScope());

            if (scope->GetMustInstantiate())
            {
                Js::OpCode op = scope->GetIsObject() ? Js::OpCode::CloneBlockScope : Js::OpCode::CloneInnerScopeSlots;

                byteCodeGenerator->Writer()->Unsigned1(op, scope->GetInnerScopeIndex());
            }
        }
    }
}